

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen11Resource_TestPlanar2DCustom_RGBP_Test::~CTestGen11Resource_TestPlanar2DCustom_RGBP_Test
          (CTestGen11Resource_TestPlanar2DCustom_RGBP_Test *this)

{
  CTestGen11Resource_TestPlanar2DCustom_RGBP_Test *this_local;
  
  CTestGen11Resource::~CTestGen11Resource(&this->super_CTestGen11Resource);
  return;
}

Assistant:

TEST_F(CTestGen11Resource, TestPlanar2DCustom_RGBP)
{
    /* Test planar surfaces where all planes are full-sized */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    const TEST_TILE_TYPE TileTypes[]          = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};
    const uint32_t          PlaneRowAlignment = 16;

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                  {512, 8},   // TileX
                                  {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_CUSTOM_PARAMS gmmParams = {};
        gmmParams.Type                        = RESOURCE_2D;
        gmmParams.Flags.Gpu.Texture           = 1;
        gmmParams.BaseWidth64                 = 0x101;
        gmmParams.BaseHeight                  = GMM_ULT_ALIGN(0x101, PlaneRowAlignment);
        SetTileFlag_Custom(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_RGBP;

        uint32_t Pitch, Height;

        Pitch  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, GMM_BYTES(64));
        Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment /* min16 rows*/) * 3 /*Y, U, V*/;

        uint32_t Size                        = Pitch * Height;
        gmmParams.Pitch                      = Pitch;
        gmmParams.Size                       = Size;
        gmmParams.PlaneOffset.X[GMM_PLANE_Y] = 0;
        gmmParams.PlaneOffset.Y[GMM_PLANE_Y] = 0;
        gmmParams.PlaneOffset.X[GMM_PLANE_U] = 0;
        gmmParams.PlaneOffset.Y[GMM_PLANE_U] = Height / 3;
        gmmParams.PlaneOffset.X[GMM_PLANE_V] = 0;
        gmmParams.PlaneOffset.Y[GMM_PLANE_V] = 2 * (Height / 3);
        gmmParams.NoOfPlanes                 = 3;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateCustomResInfoObject(&gmmParams);

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }
        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(Height / 3, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

        // V plane should be at end of U plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
        EXPECT_EQ(2 * (Height / 3), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}